

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall ON_Mesh::TransposeSurfaceParameters(ON_Mesh *this)

{
  double dVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  ON_2dPoint *pOVar5;
  ON_2dPoint *pOVar6;
  ON_2dPoint *S;
  int i;
  ON_2dPoint *S_array;
  int S_count;
  double t;
  ON_Interval temp;
  ON_Mesh *this_local;
  
  uVar2 = *(undefined8 *)&this->field_0x240;
  uVar3 = *(undefined8 *)&this->field_0x248;
  *(undefined8 *)&this->field_0x240 = *(undefined8 *)&this->field_0x250;
  *(undefined8 *)&this->field_0x248 = *(undefined8 *)&this->field_0x258;
  *(undefined8 *)&this->field_0x250 = uVar2;
  *(undefined8 *)&this->field_0x258 = uVar3;
  dVar1 = this->m_srf_scale[0];
  this->m_srf_scale[0] = this->m_srf_scale[1];
  this->m_srf_scale[1] = dVar1;
  iVar4 = ON_SimpleArray<ON_2dPoint>::Count(&(this->m_S).super_ON_SimpleArray<ON_2dPoint>);
  pOVar5 = ON_SimpleArray<ON_2dPoint>::Array(&(this->m_S).super_ON_SimpleArray<ON_2dPoint>);
  for (S._4_4_ = 0; S._4_4_ < iVar4; S._4_4_ = S._4_4_ + 1) {
    pOVar6 = pOVar5 + S._4_4_;
    dVar1 = pOVar6->x;
    pOVar6->x = pOVar6->y;
    pOVar6->y = dVar1;
  }
  return true;
}

Assistant:

bool ON_Mesh::TransposeSurfaceParameters()
{
	// swap m_srf_domain 
	ON_Interval temp = m_srf_domain[0];
	m_srf_domain[0]  = m_srf_domain[1];
	m_srf_domain[1]  = temp;

	double t = m_srf_scale[0];
	m_srf_scale[0] = m_srf_scale[1];
  m_srf_scale[1] = t;

  int S_count = m_S.Count();
  ON_2dPoint* S_array = m_S.Array();
  for (int i = 0; i < S_count; i++ )
  {
    ON_2dPoint& S = S_array[i];
    t = S.x; S.x = S.y; S.y = t;
  }
  return true;
}